

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case0115(ParserTester *this)

{
  string text;
  Expectation X;
  undefined1 in_stack_fffffffffffffef8 [40];
  undefined8 in_stack_ffffffffffffff20;
  anon_union_8_2_2d0bec1f_for_MacroTranslations_0 in_stack_ffffffffffffff28;
  anon_union_8_2_2d0bec1f_for_LanguageExtensions_1 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff40 [112];
  ParseOptions in_stack_ffffffffffffffb0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff00,"x ( * ( * ( * y ) ) ) ( z ) ;",
             (allocator<char> *)&stack0xfffffffffffffeff);
  Expectation::Expectation((Expectation *)&stack0xffffffffffffff40);
  ParseOptions::ParseOptions((ParseOptions *)&stack0xffffffffffffff20);
  text._M_string_length = in_stack_ffffffffffffff28.BF_all_;
  text._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff20;
  text.field_2._M_allocated_capacity = in_stack_ffffffffffffff30.BF_all_;
  text.field_2._8_8_ = in_stack_ffffffffffffff38;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff20;
  X.numE_ = in_stack_fffffffffffffef8._0_4_;
  X.numW_ = in_stack_fffffffffffffef8._4_4_;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffef8._8_24_;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffef8._32_8_;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffff28.BF_all_;
  X.continueTestDespiteOfErrors_ = (bool)in_stack_ffffffffffffff30._0_1_;
  X.containsAmbiguity_ = (bool)in_stack_ffffffffffffff30._1_1_;
  X._58_6_ = in_stack_ffffffffffffff30._2_6_;
  X.ambiguityText_._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff38;
  X.ambiguityText_._M_string_length = in_stack_ffffffffffffff40._0_8_;
  X.ambiguityText_.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffff40._8_16_;
  X.unfinishedParse_ = (bool)in_stack_ffffffffffffff40[0x18];
  X._97_7_ = in_stack_ffffffffffffff40._25_7_;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data =
       (_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>)
       (_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>)
       in_stack_ffffffffffffff40._32_24_;
  X.declarations_.super__Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)in_stack_ffffffffffffff40._56_24_;
  X.checkScope_ = (bool)in_stack_ffffffffffffff40[0x50];
  X._153_7_ = in_stack_ffffffffffffff40._81_7_;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data =
       (_Vector_base<int,_std::allocator<int>_>)
       (_Vector_base<int,_std::allocator<int>_>)in_stack_ffffffffffffff40._88_24_;
  parse(this,text,X,Any,in_stack_ffffffffffffffb0);
  Expectation::~Expectation((Expectation *)&stack0xffffffffffffff40);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
  return;
}

Assistant:

void ParserTester::case0115()
{
    parse("x ( * ( * ( * y ) ) ) ( z ) ;");
}